

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O1

db_bits * __thiscall lan::db::read_all_bits(db *this,string *content)

{
  db_bit *pdVar1;
  db_bit *pdVar2;
  db_bit *pdVar3;
  string str;
  
  pdVar2 = read_bit(this,content);
  pdVar1 = pdVar2;
  while (pdVar1 != (db_bit *)0x0) {
    pdVar3 = read_bit(this,content);
    pdVar1->nex = pdVar3;
    pdVar1 = pdVar3;
  }
  return pdVar2;
}

Assistant:

lan::db_bits * db::read_all_bits(std::string content){
            std::string str;
            db_bit * bit = nullptr, * f_bit;
            f_bit = bit = read_bit(content);
            while(bit) {
                bit->nex = read_bit(content);
                bit = bit->nex;
            } return f_bit;
        }